

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# member_function_pointer_kernel_1.h
# Opt level: O1

int __thiscall
dlib::mfp_kernel_1_base_class<1UL>::
mp_impl_T<dlib::member_function_pointer<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_void,_void,_void>::mp_impl<dlib::image_display>_>
::clone(mp_impl_T<dlib::member_function_pointer<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_void,_void,_void>::mp_impl<dlib::image_display>_>
        *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined8 uVar1;
  
  *(void **)(__fn + 8) =
       (this->super_mp_impl<dlib::image_display>).super_mp_base.super_mp_base_base.o;
  *(undefined4 *)(__fn + 0x10) = 0;
  *(undefined ***)__fn = &PTR__mp_base_base_00322c20;
  uVar1 = *(undefined8 *)&(this->super_mp_impl<dlib::image_display>).field_0x20;
  *(mfp_pointer_type *)(__fn + 0x18) = (this->super_mp_impl<dlib::image_display>).callback;
  *(undefined8 *)(__fn + 0x20) = uVar1;
  *(undefined ***)__fn = &PTR__mp_base_base_00322ba0;
  return 0x322ba0;
}

Assistant:

void clone   (void* ptr) const  { new(ptr) mp_impl_T(this->o,this->callback); }